

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  pointer pcVar1;
  string *psVar2;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar2 = cmTarget::GetName_abi_cxx11_(this->Target);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(psVar2->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSupportDirectory() const
{
  std::string dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  dir += "/CMakeFiles";
  dir += "/";
  dir += this->GetName();
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}